

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.h
# Opt level: O2

char * leveldb::GetVarint32Ptr(char *p,char *limit,uint32_t *value)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((p < limit) && (-1 < *p)) {
    *value = (int)*p;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return p + 1;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pcVar2 = GetVarint32PtrFallback(p,limit,value);
    return pcVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline const char* GetVarint32Ptr(const char* p, const char* limit,
                                  uint32_t* value) {
  if (p < limit) {
    uint32_t result = *(reinterpret_cast<const uint8_t*>(p));
    if ((result & 128) == 0) {
      *value = result;
      return p + 1;
    }
  }
  return GetVarint32PtrFallback(p, limit, value);
}